

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  DelayedSequenceElementSyntax *pDVar2;
  Token TVar3;
  ExpressionSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  Token *in_stack_00000030;
  SequenceExprSyntax *in_stack_00000038;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  SequenceExprSyntax *in_stack_ffffffffffffff80;
  Info *args_4;
  
  TVar3 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  args_4 = TVar3.info;
  if (((Token *)((long)__fn + 0x20))->info != (Info *)0x0) {
    deepClone<slang::syntax::ExpressionSyntax>
              ((ExpressionSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x50))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x50))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x50))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x50))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::SelectorSyntax>
              ((SelectorSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::SequenceExprSyntax_*>::operator*
            ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x94556d);
  deepClone<slang::syntax::SequenceExprSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pDVar2 = BumpAllocator::
           emplace<slang::syntax::DelayedSequenceElementSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token,slang::syntax::SequenceExprSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack,(SelectorSyntax **)args_4,in_stack_00000030,
                      in_stack_00000038);
  return (int)pDVar2;
}

Assistant:

static SyntaxNode* clone(const DelayedSequenceElementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DelayedSequenceElementSyntax>(
        node.doubleHash.deepClone(alloc),
        node.delayVal ? deepClone(*node.delayVal, alloc) : nullptr,
        node.openBracket.deepClone(alloc),
        node.op.deepClone(alloc),
        node.range ? deepClone(*node.range, alloc) : nullptr,
        node.closeBracket.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc)
    );
}